

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_3,_2> * tcu::operator+(Matrix<float,_3,_2> *a,Matrix<float,_3,_2> *b)

{
  Vector<float,_3> *pVVar1;
  bool bVar2;
  bool bVar3;
  int row;
  long lVar4;
  Matrix<float,_3,_2> *res;
  Matrix<float,_3,_2> *in_RDI;
  int row_1;
  long lVar5;
  float fVar6;
  
  (in_RDI->m_data).m_data[0].m_data[0] = 0.0;
  (in_RDI->m_data).m_data[0].m_data[1] = 0.0;
  *(undefined8 *)((in_RDI->m_data).m_data[0].m_data + 2) = 0;
  pVVar1 = (in_RDI->m_data).m_data;
  pVVar1[1].m_data[1] = 0.0;
  pVVar1[1].m_data[2] = 0.0;
  lVar4 = 0;
  do {
    fVar6 = 1.0;
    if (lVar4 != 0) {
      fVar6 = 0.0;
    }
    (in_RDI->m_data).m_data[0].m_data[lVar4] = fVar6;
    fVar6 = 1.0;
    if (lVar4 != 1) {
      fVar6 = 0.0;
    }
    (in_RDI->m_data).m_data[1].m_data[lVar4] = fVar6;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  bVar2 = true;
  do {
    bVar3 = bVar2;
    lVar5 = 0;
    do {
      (in_RDI->m_data).m_data[lVar4].m_data[lVar5] =
           (a->m_data).m_data[lVar4].m_data[lVar5] + (b->m_data).m_data[lVar4].m_data[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
    lVar4 = 1;
    bVar2 = false;
  } while (bVar3);
  return in_RDI;
}

Assistant:

Matrix<T, Rows, Cols> operator+ (const Matrix<T, Rows, Cols>& a, const Matrix<T, Rows, Cols>& b)
{
	Matrix<T, Rows, Cols> res;
	for (int col = 0; col < Cols; col++)
		for (int row = 0; row < Rows; row++)
			res(row, col) = a(row, col) + b(row, col);
	return res;
}